

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O3

void __thiscall
Atari2600::TIASound::apply_samples<(Outputs::Speaker::Action)2>
          (TIASound *this,size_t number_of_samples,MonoSample *target)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  
  if (number_of_samples != 0) {
    uVar6 = 0;
    do {
      lVar9 = 0;
      bVar3 = true;
      do {
        bVar8 = bVar3;
        iVar4 = this->divider_counter_[lVar9] + 1;
        this->divider_counter_[lVar9] = iVar4;
        if (0xe < this->control_[lVar9] - 1) goto switchD_002fc278_caseD_4;
        iVar4 = iVar4 / 0x13;
        switch((uint)this->control_[lVar9]) {
        case 1:
          if (iVar4 == this->divider_[lVar9] + 1) {
            iVar4 = this->poly4_counter_[lVar9];
            this->divider_counter_[lVar9] = 0;
LAB_002fc306:
            this->poly4_counter_[lVar9] = (iVar4 << 2 ^ iVar4 * 8) & 8U | iVar4 >> 1;
          }
          break;
        case 2:
          bVar1 = this->divider_[lVar9];
          if (iVar4 % (int)(((uint)bVar1 * 0x20 - ((uint)bVar1 + (uint)bVar1)) + 0x1e) == 0x12) {
            iVar4 = this->poly4_counter_[lVar9];
            goto LAB_002fc306;
          }
          break;
        case 3:
          if (iVar4 != this->divider_[lVar9] + 1) break;
          uVar5 = this->poly5_counter_[lVar9];
          if ((uVar5 & 1) != 0) {
            uVar2 = this->poly4_counter_[lVar9];
            this->output_state_[lVar9] = uVar2 & 1;
            this->poly4_counter_[lVar9] = (uVar2 << 2 ^ uVar2 * 8) & 8 | (int)uVar2 >> 1;
          }
          goto LAB_002fc342;
        case 7:
        case 9:
          iVar7 = this->divider_[lVar9] + 1;
          goto LAB_002fc330;
        case 8:
          if (iVar4 == this->divider_[lVar9] + 1) {
            iVar4 = this->poly9_counter_[lVar9];
            this->divider_counter_[lVar9] = 0;
            this->poly9_counter_[lVar9] = (iVar4 << 8 ^ iVar4 << 4) & 0x100U | iVar4 >> 1;
          }
          break;
        case 0xf:
          iVar7 = (uint)this->divider_[lVar9] + (uint)this->divider_[lVar9] * 2 + 3;
LAB_002fc330:
          if (iVar4 == iVar7) {
            uVar5 = this->poly5_counter_[lVar9];
            this->divider_counter_[lVar9] = 0;
LAB_002fc342:
            this->poly5_counter_[lVar9] = (uVar5 << 2 ^ uVar5 << 4) & 0x10 | (int)uVar5 >> 1;
          }
        }
switchD_002fc278_caseD_4:
        lVar9 = 1;
        bVar3 = false;
      } while (bVar8);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < number_of_samples);
  }
  return;
}

Assistant:

void Atari2600::TIASound::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	for(unsigned int c = 0; c < number_of_samples; c++) {
		Outputs::Speaker::MonoSample output = 0;
		for(int channel = 0; channel < 2; channel++) {
			divider_counter_[channel] ++;
			int divider_value = divider_counter_[channel] / (38 / CPUTicksPerAudioTick);
			int level = 0;
			switch(control_[channel]) {
				case 0x0: case 0xb:	// constant 1
					level = 1;
				break;

				case 0x4: case 0x5:	// div2 tone
					level = (divider_value / (divider_[channel]+1))&1;
				break;

				case 0xc: case 0xd:	// div6 tone
					level = (divider_value / ((divider_[channel]+1)*3))&1;
				break;

				case 0x6: case 0xa:	// div31 tone
					level = (divider_value / (divider_[channel]+1))%30 <= 18;
				break;

				case 0xe:			// div93 tone
					level = (divider_value / ((divider_[channel]+1)*3))%30 <= 18;
				break;

				case 0x1:			// 4-bit poly
					level = poly4_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly4(channel);
					}
				break;

				case 0x2:			// 4-bit poly div31
					level = poly4_counter_[channel]&1;
					if(divider_value%(30*(divider_[channel]+1)) == 18) {
						advance_poly4(channel);
					}
				break;

				case 0x3:			// 5/4-bit poly
					level = output_state_[channel];
					if(divider_value == divider_[channel]+1) {
						if(poly5_counter_[channel]&1) {
							output_state_[channel] = poly4_counter_[channel]&1;
							advance_poly4(channel);
						}
						advance_poly5(channel);
					}
				break;

				case 0x7: case 0x9:	// 5-bit poly
					level = poly5_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0xf:			// 5-bit poly div6
					level = poly5_counter_[channel]&1;
					if(divider_value == (divider_[channel]+1)*3) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0x8:			// 9-bit poly
					level = poly9_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly9(channel);
					}
				break;
			}

			output += (volume_[channel] * per_channel_volume_ * level) >> 4;
		}
		Outputs::Speaker::apply<action>(target[c], output);
	}
}